

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::NegativeApiCase::iterate(NegativeApiCase *this)

{
  deUint32 *this_00;
  int iVar1;
  deUint32 dVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *this_01;
  TestLog *pTVar5;
  NotSupportedError *pNVar6;
  MessageBuilder *pMVar7;
  Enum<int,_2UL> EVar8;
  Enum<int,_2UL> local_2f0;
  MessageBuilder local_2e0;
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158;
  GLuint local_134;
  GLint local_130;
  GLint largeBinding;
  GLint maxBindings;
  GLuint local_108;
  GLint local_104;
  GLint largeIndex;
  GLint maxIndex;
  Buffer buffer_2;
  Buffer buffer_1;
  string local_c8;
  int local_a8;
  GLint local_a4;
  GLint largeStride;
  GLint maxStride;
  Buffer buffer;
  string local_80;
  GLuint local_5c;
  GLint local_58;
  GLint largeOffset;
  GLint maxOffset;
  undefined1 local_48 [8];
  VertexArray vao;
  CallLogWrapper gl;
  GLenum error;
  NegativeApiCase *this_local;
  
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  this_01 = gles31::Context::getTestContext((this->super_TestCase).m_context);
  pTVar5 = tcu::TestContext::getLog(this_01);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar5);
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_48,pRVar4);
  this_00 = &vao.super_ObjectWrapper.m_object;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)this_00,true);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)this_00,dVar2);
  switch(this->m_caseType) {
  case CASE_LARGE_OFFSET:
    local_58 = -1;
    glu::CallLogWrapper::glGetIntegerv
              ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x82d9,&local_58);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
    glu::checkError(GVar3,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x5b4);
    local_5c = local_58 + 1;
    if ((local_58 == -1) || (local_58 == 0x7fffffff)) {
      buffer.super_ObjectWrapper._22_1_ = 1;
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Implementation supports all offsets",
                 (allocator<char> *)&buffer.super_ObjectWrapper.field_0x17);
      tcu::NotSupportedError::NotSupportedError(pNVar6,&local_80);
      buffer.super_ObjectWrapper._22_1_ = 0;
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    glu::CallLogWrapper::glVertexAttribFormat
              ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0,4,0x1406,'\0',local_5c);
    break;
  case CASE_LARGE_STRIDE:
    pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)&largeStride,pRVar4);
    local_a4 = -1;
    glu::CallLogWrapper::glGetIntegerv
              ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x82e5,&local_a4);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
    glu::checkError(GVar3,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x5c7);
    local_a8 = local_a4 + 1;
    if ((local_a4 == -1) || (local_a4 == 0x7fffffff)) {
      buffer_1.super_ObjectWrapper._22_1_ = 1;
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"Implementation supports all strides",
                 (allocator<char> *)&buffer_1.super_ObjectWrapper.field_0x17);
      tcu::NotSupportedError::NotSupportedError(pNVar6,&local_c8);
      buffer_1.super_ObjectWrapper._22_1_ = 0;
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&largeStride);
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0,dVar2,0,local_a8);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)&largeStride);
    break;
  case CASE_NEGATIVE_STRIDE:
    pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)&buffer_2.super_ObjectWrapper.m_object,
               pRVar4);
    dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&buffer_2.super_ObjectWrapper.m_object);
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0,dVar2,0,-0x14);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)&buffer_2.super_ObjectWrapper.m_object);
    break;
  case CASE_NEGATIVE_OFFSET:
    pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)&largeIndex,pRVar4);
    dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&largeIndex);
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0,dVar2,-0x14,0);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)&largeIndex);
    break;
  case CASE_INVALID_ATTR:
    local_104 = -1;
    glu::CallLogWrapper::glGetIntegerv
              ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x8869,&local_104);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
    glu::checkError(GVar3,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x5e7);
    local_108 = local_104 + 1;
    if ((local_104 == -1) || (local_104 == 0x7fffffff)) {
      largeBinding._2_1_ = 1;
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&maxBindings,"Implementation supports any attribute index",
                 (allocator<char> *)((long)&largeBinding + 3));
      tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)&maxBindings);
      largeBinding._2_1_ = 0;
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    glu::CallLogWrapper::glVertexAttribBinding
              ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,local_108,0);
    break;
  case CASE_INVALID_BINDING:
    local_130 = -1;
    glu::CallLogWrapper::glGetIntegerv
              ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x82da,&local_130);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
    glu::checkError(GVar3,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x5f9);
    local_134 = local_130 + 1;
    if ((local_130 == -1) || (local_130 == 0x7fffffff)) {
      local_15a = 1;
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"Implementation supports any binding",&local_159);
      tcu::NotSupportedError::NotSupportedError(pNVar6,&local_158);
      local_15a = 0;
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    glu::CallLogWrapper::glVertexAttribBinding
              ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0,local_134);
  }
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
  if (GVar3 == 0x501) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_2e0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_2e0,(char (*) [39])"ERROR! Expected GL_INVALID_VALUE, got ");
    EVar8 = glu::getErrorStr(GVar3);
    local_2f0.m_getName = EVar8.m_getName;
    local_2f0.m_value = EVar8.m_value;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_2f0);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2e0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Invalid error");
  }
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_48);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
  return STOP;
}

Assistant:

NegativeApiCase::IterateResult NegativeApiCase::iterate (void)
{
	glw::GLenum			error;
	glu::CallLogWrapper gl		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	glu::VertexArray	vao		(m_context.getRenderContext());

	gl.enableLogging(true);
	gl.glBindVertexArray(*vao);

	switch (m_caseType)
	{
		case CASE_LARGE_OFFSET:
		{
			glw::GLint	maxOffset	= -1;
			glw::GLint	largeOffset;

			gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, &maxOffset);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

			largeOffset = maxOffset + 1;

			// skip if maximum unsigned or signed values
			if (maxOffset == -1 || maxOffset == 0x7FFFFFFF)
				throw tcu::NotSupportedError("Implementation supports all offsets");

			gl.glVertexAttribFormat(0, 4, GL_FLOAT, GL_FALSE, largeOffset);
			break;
		}

		case CASE_LARGE_STRIDE:
		{
			glu::Buffer buffer		(m_context.getRenderContext());
			glw::GLint	maxStride	= -1;
			glw::GLint	largeStride;

			gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_STRIDE, &maxStride);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

			largeStride = maxStride + 1;

			// skip if maximum unsigned or signed values
			if (maxStride == -1 || maxStride == 0x7FFFFFFF)
				throw tcu::NotSupportedError("Implementation supports all strides");

			gl.glBindVertexBuffer(0, *buffer, 0, largeStride);
			break;
		}

		case CASE_NEGATIVE_STRIDE:
		{
			glu::Buffer buffer(m_context.getRenderContext());
			gl.glBindVertexBuffer(0, *buffer, 0, -20);
			break;
		}

		case CASE_NEGATIVE_OFFSET:
		{
			glu::Buffer buffer(m_context.getRenderContext());
			gl.glBindVertexBuffer(0, *buffer, -20, 0);
			break;
		}

		case CASE_INVALID_ATTR:
		{
			glw::GLint maxIndex = -1;
			glw::GLint largeIndex;

			gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &maxIndex);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

			largeIndex = maxIndex + 1;

			// skip if maximum unsigned or signed values
			if (maxIndex == -1 || maxIndex == 0x7FFFFFFF)
				throw tcu::NotSupportedError("Implementation supports any attribute index");

			gl.glVertexAttribBinding(largeIndex, 0);
			break;
		}

		case CASE_INVALID_BINDING:
		{
			glw::GLint maxBindings = -1;
			glw::GLint largeBinding;

			gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &maxBindings);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

			largeBinding = maxBindings + 1;

			// skip if maximum unsigned or signed values
			if (maxBindings == -1 || maxBindings == 0x7FFFFFFF)
				throw tcu::NotSupportedError("Implementation supports any binding");

			gl.glVertexAttribBinding(0, largeBinding);
			break;
		}

		default:
			DE_ASSERT(false);
	}

	error = gl.glGetError();

	if (error != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR! Expected GL_INVALID_VALUE, got " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}